

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O2

Result __thiscall
Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>
          (LAKBO *this,MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *t0,
          MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *t1)

{
  Result RVar1;
  anon_class_1_0_00000001 iterFlat;
  anon_class_1_0_00000001 local_1e1;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  local_1e0;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::_lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)_1_::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::_lambda(auto:1&)_1_,Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::_lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)_1_::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::_lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)_1_::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::_lambda(auto:1&)_1_::TEMPNAMEPLACEHOLDERVALUE(Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::_lambda(auto:1)_1_,Kernel::PolyNf_const&>>>>>
  local_198 [72];
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>_>
  local_150;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>
  local_c0;
  
  cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>_>::anon_class_1_0_00000001::
  operator()((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
              *)local_198,&local_1e1,t0);
  cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>_>::anon_class_1_0_00000001::
  operator()(&local_1e0,&local_1e1,t1);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(auto:1&)#1},Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(auto:1&)#1}::TEMPNAMEPLACEHOLDERVALUE(Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(auto:1)#1},Kernel::PolyNf_const&>>>>>
  ::operator()(&local_150,local_198,&local_1e0);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(auto:1&)#1},Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::Integer...l::PolyNf_const&>>>>>)::{lambda(Kernel::PolyNf_const&)#1},std::pair<Kernel::PolyNf,Kernel::PolyNf>>>
  ::
  map<Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::_lambda(auto:1)_1_>
            (&local_c0,&local_150,(anon_class_8_1_8991fb9c_for__func)this);
  RVar1 = AlascaOrderingUtils::
          lexIter<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>_>
                    (&local_c0);
  return RVar1;
}

Assistant:

Ordering::Result cmpSameSkeleton(MonomFactors<NumTraits> const& t0, MonomFactors<NumTraits> const& t1) const 
  { 
    auto iterFlat = [](MonomFactors<NumTraits> const& m) {
      return m.iter()
        .flatMap([](auto& x) { return 
            range(0, x.power)
              .map([&](auto) -> auto& { return x.term; }); });
    };
    return AlascaOrderingUtils::lexIter(
        iterFlat(t0).zip(iterFlat(t1))
          .map([&](auto pair) { return cmpSameSkeleton(pair.first, pair.second); })
        );
  }